

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gridsample_nearest_compute_blob.h
# Opt level: O2

void ncnn::gridsample_3d_nearest_compute_blob<(ncnn::GridSample::PaddingMode)2,false>
               (Mat *src,Mat *grid,Mat *offset_value,int permute_fusion)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar4;
  undefined8 uVar3;
  undefined4 uVar5;
  int iVar6;
  void *pvVar7;
  size_t sVar8;
  size_t sVar9;
  int iVar10;
  long lVar11;
  int iVar12;
  undefined4 extraout_EDX;
  uint uVar13;
  undefined4 extraout_EDX_00;
  int *piVar14;
  long lVar15;
  long lVar16;
  int iVar17;
  float fVar18;
  float fVar19;
  uint uVar20;
  uint uVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  float fVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  
  iVar17 = grid->h * grid->w * grid->d;
  piVar14 = (int *)offset_value->data;
  if (permute_fusion == 0) {
    sVar8 = grid->cstep;
    sVar9 = grid->elemsize;
    lVar15 = (long)grid->data + 8;
    for (lVar11 = 0; lVar11 < grid->c; lVar11 = lVar11 + 1) {
      for (lVar16 = 0; (int)lVar16 < iVar17; lVar16 = lVar16 + 3) {
        iVar6 = src->d;
        fVar26 = (float)iVar6;
        fVar18 = (*(float *)(lVar15 + lVar16 * 4) * 0.5 + 0.5) * fVar26 + -0.5;
        if (fVar18 <= 0.0) {
          fVar18 = 0.0;
        }
        fVar26 = fVar26 + -1.0;
        if (fVar18 <= fVar26) {
          fVar26 = fVar18;
        }
        uVar3 = *(undefined8 *)(lVar15 + -8 + lVar16 * 4);
        uVar2 = src->w;
        uVar5 = src->h;
        fVar18 = (float)DAT_0053c810;
        fVar19 = DAT_0053c810._4_4_;
        auVar28._0_4_ = ((float)uVar3 * fVar18 + fVar18) * (float)(int)uVar2 + -0.5;
        auVar28._4_4_ = ((float)((ulong)uVar3 >> 0x20) * fVar19 + fVar19) * (float)(int)uVar5 + -0.5
        ;
        auVar28._8_4_ = (DAT_0053c810._8_4_ * 0.0 + DAT_0053c810._8_4_) * 0.0 + 0.0;
        auVar28._12_4_ = (DAT_0053c810._12_4_ * 0.0 + DAT_0053c810._12_4_) * 0.0 + 0.0;
        auVar28 = maxps(auVar28,_DAT_00545cc0);
        auVar23._0_4_ = (float)(int)uVar2 + -1.0;
        auVar23._4_4_ = (float)(int)uVar5 + -1.0;
        auVar23._8_8_ = 0;
        auVar23 = minps(auVar23,auVar28);
        fVar18 = floorf(auVar23._0_4_ + fVar18);
        fVar19 = floorf(auVar23._4_4_ + fVar19);
        fVar26 = floorf(fVar26 + 0.5);
        iVar10 = (int)fVar26;
        iVar12 = -1;
        if ((iVar10 < iVar6) && (-1 < iVar10)) {
          uVar20 = (uint)fVar18;
          uVar21 = (uint)fVar19;
          auVar25._0_4_ = -(uint)((int)uVar20 < (int)uVar2);
          auVar25._4_4_ = auVar25._0_4_;
          auVar25._8_4_ = -(uint)((int)uVar21 < (int)uVar5);
          auVar25._12_4_ = -(uint)((int)uVar21 < (int)uVar5);
          uVar13 = movmskpd(extraout_EDX_00,auVar25);
          if (((byte)((byte)uVar13 >> 1) != 0) &&
             (((uVar13 & 1) != 0 && (-1 < (int)(uVar21 | uVar20))))) {
            iVar12 = (uVar2 * (uVar5 * iVar10 + uVar21) + uVar20) * src->elempack;
          }
        }
        *piVar14 = iVar12;
        piVar14 = piVar14 + 1;
      }
      lVar15 = lVar15 + sVar8 * sVar9;
    }
  }
  else {
    lVar11 = grid->elemsize * grid->cstep;
    pvVar7 = grid->data;
    lVar15 = 0;
    if (iVar17 < 1) {
      iVar17 = 0;
    }
    for (; iVar17 != (int)lVar15; lVar15 = lVar15 + 1) {
      iVar6 = src->d;
      fVar26 = (float)iVar6;
      fVar18 = (*(float *)((long)pvVar7 + lVar15 * 4 + lVar11 * 2) * 0.5 + 0.5) * fVar26 + -0.5;
      if (fVar18 <= 0.0) {
        fVar18 = 0.0;
      }
      fVar26 = fVar26 + -1.0;
      if (fVar18 <= fVar26) {
        fVar26 = fVar18;
      }
      uVar1 = src->w;
      uVar4 = src->h;
      auVar22._0_4_ = (*(float *)((long)pvVar7 + lVar15 * 4) * 0.5 + 0.5) * (float)(int)uVar1 + -0.5
      ;
      auVar22._4_4_ =
           (*(float *)((long)pvVar7 + lVar15 * 4 + lVar11) * 0.5 + 0.5) * (float)(int)uVar4 + -0.5;
      auVar22._8_8_ = 0;
      auVar23 = maxps(auVar22,_DAT_00545cc0);
      auVar27._0_4_ = (float)(int)uVar1 + -1.0;
      auVar27._4_4_ = (float)(int)uVar4 + -1.0;
      auVar27._8_8_ = 0;
      auVar23 = minps(auVar27,auVar23);
      fVar18 = floorf(auVar23._0_4_ + 0.5);
      fVar19 = floorf(auVar23._4_4_ + 0.5);
      fVar26 = floorf(fVar26 + 0.5);
      iVar10 = (int)fVar26;
      iVar12 = -1;
      if ((iVar10 < iVar6) && (-1 < iVar10)) {
        uVar20 = (uint)fVar18;
        uVar21 = (uint)fVar19;
        auVar24._0_4_ = -(uint)((int)uVar20 < (int)uVar1);
        auVar24._4_4_ = auVar24._0_4_;
        auVar24._8_4_ = -(uint)((int)uVar21 < (int)uVar4);
        auVar24._12_4_ = -(uint)((int)uVar21 < (int)uVar4);
        uVar13 = movmskpd(extraout_EDX,auVar24);
        if (((byte)((byte)uVar13 >> 1) != 0) &&
           (((uVar13 & 1) != 0 && (-1 < (int)(uVar21 | uVar20))))) {
          iVar12 = (uVar1 * (uVar4 * iVar10 + uVar21) + uVar20) * src->elempack;
        }
      }
      piVar14[lVar15] = iVar12;
    }
  }
  return;
}

Assistant:

void gridsample_3d_nearest_compute_blob(const Mat& src, const Mat& grid, Mat& offset_value, int permute_fusion)
{
    const int grid_size = grid.w * grid.h * grid.d;

    float* offset_ptr = offset_value.channel(0);

    grid_sample_unormalize<align_corner> unormalize;
    compute_coord<pd, align_corner> get_coord;

    if (permute_fusion == 0)
    {
        for (int y = 0; y < grid.c; y++)
        {
            const float* gridptr = grid.channel(y);
            int x = 0;
#if __AVX__
            for (; x + 23 < grid_size; x += 24)
            {
                __m256 gx = _mm256_loadu_ps(gridptr);
                __m256 gy = _mm256_loadu_ps(gridptr + 8);
                __m256 gz = _mm256_loadu_ps(gridptr + 16);

                transpose3x8_ps(gx, gy, gz);

                gx = unormalize(_mm256_set1_ps(src.w), gx);
                gx = get_coord(_mm256_set1_ps(src.w), gx);

                gy = unormalize(_mm256_set1_ps(src.h), gy);
                gy = get_coord(_mm256_set1_ps(src.h), gy);

                gz = unormalize(_mm256_set1_ps(src.d), gz);
                gz = get_coord(_mm256_set1_ps(src.d), gz);

                gx = _mm256_floor_ps(_mm256_add_ps(gx, _mm256_set1_ps(0.5f)));
                gy = _mm256_floor_ps(_mm256_add_ps(gy, _mm256_set1_ps(0.5f)));
                gz = _mm256_floor_ps(_mm256_add_ps(gz, _mm256_set1_ps(0.5f)));

                __m256 v_in_range = _mm256_and_ps(_mm256_and_ps(_mm256_cmp_ps(gx, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.w), gx, _CMP_GT_OS)),
                                                  _mm256_and_ps(_mm256_cmp_ps(gy, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.h), gy, _CMP_GT_OS)));
                v_in_range = _mm256_and_ps(v_in_range, _mm256_and_ps(_mm256_cmp_ps(gz, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.d), gz, _CMP_GT_OS)));

                __m256 offset = _mm256_mul_ps(_mm256_comp_fmadd_ps(_mm256_mul_ps(_mm256_set1_ps(src.w), _mm256_set1_ps(src.h)), gz,
                                              _mm256_comp_fmadd_ps(gy, _mm256_set1_ps(src.w), gx)),
                                              _mm256_set1_ps(src.elempack));

                offset = _mm256_blendv_ps(_mm256_set1_ps(-1.0f), _mm256_castsi256_ps(_mm256_cvtps_epi32(offset)), v_in_range);

                _mm256_storeu_ps(offset_ptr, offset);

                gridptr += 24;
                offset_ptr += 8;
            }

#endif // __AVX__

            for (; x < grid_size; x += 3)
            {
                float sample_x = *gridptr;
                float sample_y = *(gridptr + 1);
                float sample_z = *(gridptr + 2);

                sample_x = unormalize(src.w, sample_x);
                sample_x = get_coord(src.w, sample_x);

                sample_y = unormalize(src.h, sample_y);
                sample_y = get_coord(src.h, sample_y);

                sample_z = unormalize(src.d, sample_z);
                sample_z = get_coord(src.d, sample_z);

                int x0 = static_cast<int>(floorf(sample_x + 0.5f));
                int y0 = static_cast<int>(floorf(sample_y + 0.5f));
                int z0 = static_cast<int>(floorf(sample_z + 0.5f));

                bool in_bound = ((x0 > -1) & (x0 < src.w) & (y0 > -1) & (y0 < src.h) & (z0 > -1) & (z0 < src.d));

                int* iptr = (int*)offset_ptr;
                *iptr = in_bound ? (x0 + y0 * src.w + z0 * src.w * src.h) * src.elempack : -1.0;

                gridptr += 3;
                offset_ptr++;
            }
        }
    }
    else
    {
        const float* gridptr_x = grid.channel(0);
        const float* gridptr_y = grid.channel(1);
        const float* gridptr_z = grid.channel(2);

        int x = 0;
#if __AVX__
        for (; x + 7 < grid_size; x += 8)
        {
            __m256 gx = _mm256_loadu_ps(gridptr_x);
            __m256 gy = _mm256_loadu_ps(gridptr_y);
            __m256 gz = _mm256_loadu_ps(gridptr_z);

            gx = unormalize(_mm256_set1_ps(src.w), gx);
            gx = get_coord(_mm256_set1_ps(src.w), gx);

            gy = unormalize(_mm256_set1_ps(src.h), gy);
            gy = get_coord(_mm256_set1_ps(src.h), gy);

            gz = unormalize(_mm256_set1_ps(src.d), gz);
            gz = get_coord(_mm256_set1_ps(src.d), gz);

            gx = _mm256_floor_ps(_mm256_add_ps(gx, _mm256_set1_ps(0.5f)));
            gy = _mm256_floor_ps(_mm256_add_ps(gy, _mm256_set1_ps(0.5f)));
            gz = _mm256_floor_ps(_mm256_add_ps(gz, _mm256_set1_ps(0.5f)));

            __m256 v_in_range = _mm256_and_ps(_mm256_and_ps(_mm256_cmp_ps(gx, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.w), gx, _CMP_GT_OS)),
                                              _mm256_and_ps(_mm256_cmp_ps(gy, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.h), gy, _CMP_GT_OS)));
            v_in_range = _mm256_and_ps(v_in_range, _mm256_and_ps(_mm256_cmp_ps(gz, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.d), gz, _CMP_GT_OS)));

            __m256 offset = _mm256_mul_ps(_mm256_comp_fmadd_ps(_mm256_mul_ps(_mm256_set1_ps(src.w), _mm256_set1_ps(src.h)), gz,
                                          _mm256_comp_fmadd_ps(gy, _mm256_set1_ps(src.w), gx)),
                                          _mm256_set1_ps(src.elempack));

            offset = _mm256_blendv_ps(_mm256_set1_ps(-1.0f), _mm256_castsi256_ps(_mm256_cvtps_epi32(offset)), v_in_range);

            _mm256_storeu_ps(offset_ptr, offset);

            gridptr_x += 8;
            gridptr_y += 8;
            gridptr_z += 8;

            offset_ptr += 8;
        }

#endif // __AVX__

        for (; x < grid_size; x++)
        {
            float sample_x = *gridptr_x;
            float sample_y = *gridptr_y;
            float sample_z = *gridptr_z;

            sample_x = unormalize(src.w, sample_x);
            sample_x = get_coord(src.w, sample_x);

            sample_y = unormalize(src.h, sample_y);
            sample_y = get_coord(src.h, sample_y);

            sample_z = unormalize(src.d, sample_z);
            sample_z = get_coord(src.d, sample_z);

            int x0 = static_cast<int>(floorf(sample_x + 0.5f));
            int y0 = static_cast<int>(floorf(sample_y + 0.5f));
            int z0 = static_cast<int>(floorf(sample_z + 0.5f));

            bool in_bound = ((x0 > -1) & (x0 < src.w) & (y0 > -1) & (y0 < src.h) & (z0 > -1) & (z0 < src.d));

            int* iptr = (int*)offset_ptr;
            *iptr = in_bound ? (x0 + y0 * src.w + z0 * src.w * src.h) * src.elempack : -1.0;

            gridptr_x++;
            gridptr_y++;
            gridptr_z++;

            offset_ptr++;
        }
    }
}